

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O1

BitMatrix *
ZXing::ParseBitMatrix(BitMatrix *__return_storage_ptr__,string *str,char one,bool expectSpace)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint height;
  int width;
  
  uVar2 = std::__cxx11::string::find((char)str,10);
  if (uVar2 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    (__return_storage_ptr__->_bits).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    width = (int)(uVar2 >> (expectSpace & 0x3fU));
    height = (uint)(str->_M_string_length / (uVar2 + 1));
    BitMatrix::BitMatrix(__return_storage_ptr__,width,height);
    if (0 < (int)height) {
      uVar3 = 0;
      do {
        if (0 < width) {
          lVar4 = (uVar2 + 1) * uVar3;
          lVar5 = 0;
          do {
            if ((str->_M_dataplus)._M_p[lVar4] == one) {
              lVar6 = (long)(__return_storage_ptr__->_width * (int)uVar3);
              puVar1 = (__return_storage_ptr__->_bits).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(__return_storage_ptr__->_bits).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                  (ulong)(lVar5 + lVar6)) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              puVar1[lVar5 + lVar6] = 0xff;
            }
            lVar4 = lVar4 + (ulong)expectSpace + 1;
            lVar5 = lVar5 + 1;
          } while (width != (int)lVar5);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (height & 0x7fffffff));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix ParseBitMatrix(const std::string& str, char one, bool expectSpace)
{
	auto lineLength = str.find('\n');
	if (lineLength == std::string::npos)
		return {};

	int strStride = expectSpace ? 2 : 1;
	int height = narrow_cast<int>(str.length() / (lineLength + 1));
	int width = narrow_cast<int>(lineLength / strStride);
	BitMatrix mat(width, height);
	for (int y = 0; y < height; ++y) {
		size_t offset = y * (lineLength + 1);
		for (int x = 0; x < width; ++x, offset += strStride) {
			if (str[offset] == one)
				mat.set(x, y);
		}
	}
	return mat;
}